

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

uint256 * anon_unknown.dwarf_1e9f79c::GetPrevoutsSHA256<CMutableTransaction>
                    (CMutableTransaction *txTo)

{
  bool bVar1;
  COutPoint *in_RDI;
  long in_FS_OFFSET;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  HashWriter ss;
  COutPoint *obj;
  reference in_stack_ffffffffffffff68;
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  obj = in_RDI;
  memset(local_70,0,0x68);
  HashWriter::HashWriter((HashWriter *)in_RDI);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin((vector<CTxIn,_std::allocator<CTxIn>_> *)obj);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end((vector<CTxIn,_std::allocator<CTxIn>_> *)obj);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)in_stack_ffffffffffffff68,
                       (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)obj);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffff68 =
         __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
         operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                   in_RDI);
    HashWriter::operator<<((HashWriter *)in_stack_ffffffffffffff68,obj);
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               in_RDI);
  }
  HashWriter::GetSHA256((HashWriter *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint256 *)obj;
  }
  __stack_chk_fail();
}

Assistant:

uint256 GetPrevoutsSHA256(const T& txTo)
{
    HashWriter ss{};
    for (const auto& txin : txTo.vin) {
        ss << txin.prevout;
    }
    return ss.GetSHA256();
}